

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmStringAlgorithms.h
# Opt level: O2

string * cmStrCat<char[24],std::__cxx11::string,char[7],cm::static_string_view,char[16],std::__cxx11::string,char[7],cm::static_string_view,char[2]>
                   (string *__return_storage_ptr__,cmAlphaNum *a,cmAlphaNum *b,char (*args) [24],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_1,
                   char (*args_2) [7],static_string_view *args_3,char (*args_4) [16],
                   basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *args_5,
                   char (*args_6) [7],static_string_view *args_7,char (*args_8) [2])

{
  initializer_list<std::basic_string_view<char,_std::char_traits<char>_>_> views;
  basic_string_view<char,_std::char_traits<char>_> local_e0;
  size_t local_d0;
  char *pcStack_c8;
  size_t local_c0;
  char (*local_b8) [24];
  size_type local_b0;
  pointer local_a8;
  size_t local_a0;
  char (*local_98) [7];
  size_t local_90;
  char *pcStack_88;
  size_t local_80;
  char (*local_78) [16];
  size_type local_70;
  pointer local_68;
  size_t local_60;
  char (*local_58) [7];
  size_t local_50;
  char *pcStack_48;
  size_t local_40;
  char (*local_38) [2];
  
  local_e0._M_len = (a->View_)._M_len;
  local_e0._M_str = (a->View_)._M_str;
  local_d0 = (b->View_)._M_len;
  pcStack_c8 = (b->View_)._M_str;
  local_c0 = strlen(*args);
  local_a8 = (args_1->_M_dataplus)._M_p;
  local_b0 = args_1->_M_string_length;
  local_b8 = args;
  local_a0 = strlen(*args_2);
  local_90 = (args_3->super_string_view)._M_len;
  pcStack_88 = (args_3->super_string_view)._M_str;
  local_98 = args_2;
  local_80 = strlen(*args_4);
  local_78 = args_4;
  local_68 = (args_5->_M_dataplus)._M_p;
  local_70 = args_5->_M_string_length;
  local_60 = strlen(*args_6);
  local_58 = args_6;
  local_50 = (args_7->super_string_view)._M_len;
  pcStack_48 = (args_7->super_string_view)._M_str;
  local_40 = strlen(*args_8);
  local_38 = args_8;
  views._M_len = 0xb;
  views._M_array = &local_e0;
  cmCatViews_abi_cxx11_(__return_storage_ptr__,views);
  return __return_storage_ptr__;
}

Assistant:

inline std::string cmStrCat(cmAlphaNum const& a, cmAlphaNum const& b,
                            AV const&... args)
{
  return cmCatViews(
    { a.View(), b.View(), static_cast<cmAlphaNum const&>(args).View()... });
}